

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall r_exec::View::View(View *this,View *view,Group *group)

{
  P<r_code::Code> *this_00;
  Group *this_01;
  _Object *p_Var1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  ushort uVar9;
  uint64_t uVar10;
  Atom *this_02;
  float fVar11;
  float fVar12;
  float fVar13;
  Atom local_34 [4];
  Atom local_30 [4];
  Atom local_2c [4];
  
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_001c1620;
  (this->controller).object = (_Object *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_groupMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_groupMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  uVar9 = r_code::Atom::asIndex();
  this_01 = (Group *)(view->super_View).references[uVar9];
  this_00 = &(this->super_View).object;
  core::P<r_code::Code>::operator=(this_00,&(view->super_View).object);
  uVar3 = *(undefined8 *)&(view->super_View).field_0x30;
  uVar4 = *(undefined8 *)&(view->super_View).field_0x38;
  uVar5 = *(undefined8 *)&(view->super_View).field_0x40;
  uVar6 = *(undefined8 *)&(view->super_View).field_0x48;
  uVar7 = *(undefined8 *)&(view->super_View).field_0x50;
  *(undefined8 *)&(this->super_View).field_0x28 = *(undefined8 *)&(view->super_View).field_0x28;
  *(undefined8 *)&(this->super_View).field_0x30 = uVar3;
  *(undefined8 *)&(this->super_View).field_0x38 = uVar4;
  *(undefined8 *)&(this->super_View).field_0x40 = uVar5;
  *(undefined8 *)&(this->super_View).field_0x48 = uVar6;
  *(undefined8 *)&(this->super_View).field_0x50 = uVar7;
  *(undefined4 *)&(this->super_View).field_0x58 = *(undefined4 *)&(view->super_View).field_0x58;
  uVar10 = GetOID();
  *(int *)&(this->super_View).field_0x58 = (int)uVar10;
  (this->super_View).references[0] = (Code *)group;
  (this->super_View).references[1] = (Code *)this_01;
  fVar11 = (float)r_code::Atom::asFloat();
  fVar12 = Group::get_sln_thr(this_01);
  fVar13 = Group::get_sln_thr(group);
  if ((fVar11 != 0.0) || (fVar2 = fVar13, NAN(fVar11))) {
    if (fVar12 <= 0.0) {
      fVar2 = fVar13 + fVar11;
    }
    else {
      fVar2 = fVar11;
      if (0.0 < fVar13) {
        fVar12 = (fVar11 * fVar13) / fVar12;
        fVar2 = 1.0;
        if (fVar12 <= 1.0) {
          fVar2 = fVar12;
        }
      }
    }
  }
  r_code::Atom::Float(fVar2);
  r_code::Atom::operator=((Atom *)&(this->super_View).field_0x34,local_2c);
  r_code::Atom::~Atom(local_2c);
  p_Var1 = this_00->object;
  (*p_Var1->_vptr__Object[4])(p_Var1,0);
  bVar8 = r_code::Atom::getDescriptor();
  if (bVar8 - 0xc9 < 7) {
    fVar11 = (float)r_code::Atom::asFloat();
    fVar12 = Group::get_act_thr(this_01);
    fVar13 = Group::get_act_thr(group);
    if ((fVar11 != 0.0) || (fVar2 = fVar13, NAN(fVar11))) {
      if (fVar12 <= 0.0) {
        fVar2 = fVar13 + fVar11;
      }
      else {
        fVar2 = fVar11;
        if (0.0 < fVar13) {
          fVar12 = (fVar11 * fVar13) / fVar12;
          fVar2 = 1.0;
          if (fVar12 <= 1.0) {
            fVar2 = fVar12;
          }
        }
      }
    }
    r_code::Atom::Float(fVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x44,local_34);
    this_02 = local_34;
  }
  else {
    if (bVar8 != 200) goto LAB_0019d096;
    fVar11 = (float)r_code::Atom::asFloat();
    fVar12 = Group::get_vis_thr(this_01);
    fVar13 = Group::get_vis_thr(group);
    if ((fVar11 != 0.0) || (fVar2 = fVar13, NAN(fVar11))) {
      if (fVar12 <= 0.0) {
        fVar2 = fVar13 + fVar11;
      }
      else {
        fVar2 = fVar11;
        if (0.0 < fVar13) {
          fVar12 = (fVar11 * fVar13) / fVar12;
          fVar2 = 1.0;
          if (fVar12 <= 1.0) {
            fVar2 = fVar12;
          }
        }
      }
    }
    r_code::Atom::Float(fVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x48,local_30);
    this_02 = local_30;
  }
  r_code::Atom::~Atom(this_02);
LAB_0019d096:
  reset(this);
  return;
}

Assistant:

View::View(View *view, Group *group): r_code::View(), controller(nullptr)
{
    Group *source = view->get_host();
    object = view->object;
    memcpy(_code, view->_code, VIEW_CODE_MAX_SIZE * sizeof(Atom));
    _code[VIEW_OID].atom = GetOID();
    references[0] = group; // host.
    references[1] = source; // origin.
    // morph ctrl values; NB: res is not morphed as it is expressed as a multiple of the upr.
    code(VIEW_SLN) = Atom::Float(MorphValue(view->code(VIEW_SLN).asFloat(), source->get_sln_thr(), group->get_sln_thr()));

    switch (object->code(0).getDescriptor()) {
    case Atom::GROUP:
        code(GRP_VIEW_VIS) = Atom::Float(MorphValue(view->code(GRP_VIEW_VIS).asFloat(), source->get_vis_thr(), group->get_vis_thr()));
        break;

    case Atom::NULL_PROGRAM:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        code(VIEW_ACT) = Atom::Float(MorphValue(view->code(VIEW_ACT).asFloat(), source->get_act_thr(), group->get_act_thr()));
        break;
    }

    reset();
}